

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImGuiWindow *pIVar1;
  value_type *pvVar2;
  float val;
  ImGuiID column_id;
  float t;
  ImGuiWindow *window;
  float offset_local;
  int column_index_local;
  
  pIVar1 = GetCurrentWindow();
  window._4_4_ = column_index;
  if (column_index < 0) {
    window._4_4_ = (pIVar1->DC).ColumnsCurrent;
  }
  if (window._4_4_ < (pIVar1->DC).ColumnsData.Size) {
    val = (offset - (pIVar1->DC).ColumnsMinX) /
          ((pIVar1->DC).ColumnsMaxX - (pIVar1->DC).ColumnsMinX);
    pvVar2 = ImVector<ImGuiColumnData>::operator[](&(pIVar1->DC).ColumnsData,window._4_4_);
    pvVar2->OffsetNorm = val;
    ImGuiStorage::SetFloat((pIVar1->DC).StateStorage,(pIVar1->DC).ColumnsSetId + window._4_4_,val);
    return;
  }
  __assert_fail("column_index < window->DC.ColumnsData.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x2474,"void ImGui::SetColumnOffset(int, float)");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);
    const float t = (offset - window->DC.ColumnsMinX) / (window->DC.ColumnsMaxX - window->DC.ColumnsMinX);
    window->DC.ColumnsData[column_index].OffsetNorm = t;

    const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
    window->DC.StateStorage->SetFloat(column_id, t);
}